

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

bool cppjieba::DecodeRunesInString(char *s,size_t len,Unicode *unicode)

{
  bool bVar1;
  size_t sVar2;
  LocalVector<cppjieba::RuneStr> *in_RDX;
  size_t i;
  RuneStrArray runes;
  uint *in_stack_fffffffffffffe28;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffe40;
  size_t sVar3;
  RuneStrArray *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  size_t local_190;
  LocalVector<cppjieba::RuneStr> local_178;
  LocalVector<cppjieba::RuneStr> *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  limonp::LocalVector<unsigned_int>::clear((LocalVector<unsigned_int> *)in_stack_fffffffffffffe30);
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector(in_stack_fffffffffffffe40);
  bVar1 = DecodeRunesInString(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe48);
  if (bVar1) {
    limonp::LocalVector<cppjieba::RuneStr>::size(&local_178);
    limonp::LocalVector<unsigned_int>::reserve
              ((LocalVector<unsigned_int> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_190 = 0;
    while( true ) {
      sVar3 = local_190;
      sVar2 = limonp::LocalVector<cppjieba::RuneStr>::size(&local_178);
      if (sVar2 <= sVar3) break;
      in_stack_fffffffffffffe30 = local_20;
      limonp::LocalVector<cppjieba::RuneStr>::operator[](&local_178,local_190);
      limonp::LocalVector<unsigned_int>::push_back
                ((LocalVector<unsigned_int> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_190 = local_190 + 1;
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(in_stack_fffffffffffffe30);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, Unicode& unicode) {
  unicode.clear();
  RuneStrArray runes;
  if (!DecodeRunesInString(s, len, runes)) {
    return false;
  }
  unicode.reserve(runes.size());
  for (size_t i = 0; i < runes.size(); i++) {
    unicode.push_back(runes[i].rune);
  }
  return true;
}